

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O2

outer_range_iterator * __thiscall
burst::
semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
::skip_while_less(outer_range_iterator *__return_storage_ptr__,
                 semiintersect_iterator<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
                 *this,outer_range_iterator *range,outer_range_iterator *candidate)

{
  iterator_range<const_int_*> *piVar1;
  type_conflict3 tVar2;
  reference piVar3;
  reference piVar4;
  
  while( true ) {
    tVar2 = boost::iterators::operator!=
                      ((iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterator_range<const_int_*>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<const_int_*>_&,_long>
                        *)range,(iterator_facade<burst::owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_boost::iterator_range<const_int_*>,_boost::iterators::random_access_traversal_tag,_boost::iterator_range<const_int_*>_&,_long>
                                 *)candidate);
    if (!tVar2) break;
    piVar3 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::front
                       ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                         *)(range->m_iterator)._M_current);
    piVar4 = boost::iterator_range_detail::
             iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::front
                       ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                         *)(candidate->m_iterator)._M_current);
    if (*piVar3 < *piVar4) {
      piVar1 = (range->m_iterator)._M_current;
      piVar3 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                      *)(candidate->m_iterator)._M_current);
      skip_to_lower_bound<boost::iterator_range<int_const*>,int,std::less<void>>(piVar1,piVar3);
      piVar1 = (range->m_iterator)._M_current;
      if ((piVar1->
          super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
          super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin ==
          (piVar1->
          super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
          super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
          m_End) break;
      piVar3 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                      *)(candidate->m_iterator)._M_current);
      piVar4 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                      *)(range->m_iterator)._M_current);
      if (*piVar3 < *piVar4) break;
    }
    (range->m_iterator)._M_current = (range->m_iterator)._M_current + 1;
  }
  owning_iterator<std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  ::owning_iterator(__return_storage_ptr__,range);
  return __return_storage_ptr__;
}

Assistant:

outer_range_iterator skip_while_less (outer_range_iterator range, outer_range_iterator candidate)
        {
            while (range != candidate)
            {
                if (m_compare(range->front(), candidate->front()))
                {
                    skip_to_lower_bound(*range, candidate->front(), m_compare);
                    if (range->empty() || m_compare(candidate->front(), range->front()))
                    {
                        break;
                    }
                }

                ++range;
            }

            return range;
        }